

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O3

void __thiscall Mempool::print_list_content(Mempool *this,MEM_CAP index)

{
  int iVar1;
  iterator iVar2;
  mapped_type *ppCVar3;
  uint uVar4;
  MEM_CAP MVar5;
  mapped_type this_00;
  MEM_CAP local_28;
  MEM_CAP local_24;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mp_mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  MVar5 = index + 0x3ff;
  if (-1 < (int)index) {
    MVar5 = index;
  }
  printf("***************start to print %dkb chunk_size list data*******************\n",
         (ulong)(uint)((int)MVar5 >> 10));
  local_24 = index;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&local_24);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_Chunk_*>,_false>._M_cur !=
      (__node_type *)0x0) {
    _local_28 = CONCAT44(local_24,index);
    ppCVar3 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_28);
    uVar4 = 0;
    for (this_00 = *ppCVar3; this_00 != (Chunk *)0x0; this_00 = this_00->next) {
      if (uVar4 < 6) {
        Chunk::print_data(this_00);
      }
      uVar4 = uVar4 + 1;
    }
    puts("...");
    printf("******************end, node cnt is %d************************\n\n",(ulong)uVar4);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return;
  }
  __assert_fail("mp_pool.find(index) != mp_pool.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                ,0x73,"void Mempool::print_list_content(MEM_CAP)");
}

Assistant:

void Mempool::print_list_content(MEM_CAP index)
{
    lock_guard<mutex> lck(mp_mutex);
    int cnt = 0;
    printf("***************start to print %dkb chunk_size list data*******************\n", index/1024);
    assert(mp_pool.find(index) != mp_pool.end());
    Chunk *node = mp_pool[index];

    while (node)
    {
        if(cnt <= 5)
            node->print_data();
        cnt++;
        node = node->next;
    }
    printf("...\n");
    printf("******************end, node cnt is %d************************\n\n", cnt);
}